

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_EBMultiFabUtil.cpp
# Opt level: O1

void amrex::EB_average_down
               (MultiFab *S_fine,MultiFab *S_crse,MultiFab *vol_fine,MultiFab *vfrac_fine,int scomp,
               int ncomp,IntVect *ratio)

{
  long lVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  FArrayBox *pFVar6;
  FArrayBox *fab;
  double *pdVar7;
  double *pdVar8;
  FabType FVar9;
  EBCellFlagFab *this;
  long lVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  Periodicity *period;
  int iVar15;
  long lVar16;
  int *piVar17;
  int *piVar18;
  long lVar19;
  long lVar20;
  int iVar21;
  int iVar22;
  long lVar23;
  long lVar24;
  int iref;
  ulong uVar25;
  long lVar26;
  long lVar27;
  long lVar28;
  uint uVar29;
  long lVar30;
  long lVar31;
  long lVar32;
  ulong uVar33;
  long lVar34;
  uint uVar35;
  long lVar36;
  long lVar37;
  ulong uVar38;
  long lVar39;
  int iVar40;
  long lVar41;
  long lVar42;
  long lVar43;
  long lVar44;
  int iVar45;
  long lVar46;
  long lVar47;
  long lVar48;
  long lVar49;
  long lVar50;
  long lVar51;
  double dVar52;
  double dVar53;
  double dVar54;
  long local_530;
  long local_520;
  long local_518;
  long local_510;
  long local_4f8;
  ulong local_4e8;
  long local_4d8;
  long local_4c8;
  long local_4b8;
  Box local_484;
  Box result;
  int local_448;
  int local_444;
  int local_440;
  MFIter mfi;
  Array4<const_double> local_258;
  BoxArray crse_S_fine_BA;
  MultiFab crse_S_fine;
  
  BoxArray::BoxArray(&crse_S_fine_BA,
                     &(S_fine->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.boxarray);
  BoxArray::coarsen(&crse_S_fine_BA,ratio);
  mfi.m_fa._M_t.
  super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>._M_t.
  super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>.
  super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl =
       (__uniq_ptr_data<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>,_true,_true>)
       (__uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>)0x1;
  mfi.fabArray = (FabArrayBase *)0x0;
  mfi.tile_size.vect[0] = 0;
  mfi.tile_size.vect[1] = 0;
  mfi.tile_size.vect[2] = 0;
  mfi.flags = '\0';
  mfi._29_3_ = 0;
  mfi.currentIndex = 0;
  mfi.beginIndex = 0;
  result.smallend.vect._0_8_ = &PTR__FabFactory_008378d0;
  MultiFab::MultiFab(&crse_S_fine,&crse_S_fine_BA,
                     &(S_fine->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.distributionMap,
                     ncomp,0,(MFInfo *)&mfi,(FabFactory<amrex::FArrayBox> *)&result);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&mfi.tile_size);
  iVar2 = ratio->vect[0];
  iVar3 = ratio->vect[1];
  lVar16 = (long)iVar3;
  iVar4 = ratio->vect[2];
  MFIter::MFIter(&mfi,(FabArrayBase *)&crse_S_fine,true);
  if (mfi.currentIndex < mfi.endIndex) {
    lVar1 = (long)scomp * 8;
    do {
      piVar18 = &mfi.currentIndex;
      MFIter::tilebox(&local_484,&mfi);
      piVar17 = piVar18;
      if (mfi.local_index_map != (Vector<int,_std::allocator<int>_> *)0x0) {
        piVar17 = ((mfi.local_index_map)->super_vector<int,_std::allocator<int>_>).
                  super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                  _M_start + mfi.currentIndex;
      }
      pFVar6 = crse_S_fine.super_FabArray<amrex::FArrayBox>.m_fabs_v.
               super__Vector_base<amrex::FArrayBox_*,_std::allocator<amrex::FArrayBox_*>_>._M_impl.
               super__Vector_impl_data._M_start[*piVar17];
      if (mfi.local_index_map != (Vector<int,_std::allocator<int>_> *)0x0) {
        piVar18 = ((mfi.local_index_map)->super_vector<int,_std::allocator<int>_>).
                  super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                  _M_start + mfi.currentIndex;
      }
      fab = (S_fine->super_FabArray<amrex::FArrayBox>).m_fabs_v.
            super__Vector_base<amrex::FArrayBox_*,_std::allocator<amrex::FArrayBox_*>_>._M_impl.
            super__Vector_impl_data._M_start[*piVar18];
      this = getEBCellFlagFab(fab);
      result.smallend.vect[1] = local_484.smallend.vect[1];
      result.smallend.vect[0] = local_484.smallend.vect[0];
      result.bigend.vect[1] = local_484.bigend.vect[1];
      result.bigend.vect[2] = local_484.bigend.vect[2];
      result.smallend.vect[2] = local_484.smallend.vect[2];
      result.bigend.vect[0] = local_484.bigend.vect[0];
      iVar21 = ratio->vect[0];
      iVar40 = ratio->vect[1];
      if (((iVar21 != 1) || (iVar40 != 1)) || (ratio->vect[2] != 1)) {
        result.smallend.vect[1] = local_484.smallend.vect[1] * iVar40;
        result.smallend.vect[0] = local_484.smallend.vect[0] * iVar21;
        result.smallend.vect[2] = local_484.smallend.vect[2] * ratio->vect[2];
        uVar29 = (uint)((local_484.btype.itype & 2) == 0);
        uVar35 = (uint)((local_484.btype.itype & 4) == 0);
        result.bigend.vect[0] =
             (local_484.bigend.vect[0] + (~local_484.btype.itype & 1)) * iVar21 -
             (~local_484.btype.itype & 1);
        result.bigend.vect[1] = (local_484.bigend.vect[1] + uVar29) * iVar40 - uVar29;
        result.bigend.vect[2] = (local_484.bigend.vect[2] + uVar35) * ratio->vect[2] - uVar35;
      }
      FVar9 = EBCellFlagFab::getType(this,&result);
      pdVar7 = (pFVar6->super_BaseFab<double>).dptr;
      iVar21 = (pFVar6->super_BaseFab<double>).domain.smallend.vect[0];
      lVar27 = (long)iVar21;
      iVar40 = (pFVar6->super_BaseFab<double>).domain.smallend.vect[1];
      lVar30 = (long)iVar40;
      iVar22 = (pFVar6->super_BaseFab<double>).domain.smallend.vect[2];
      lVar36 = (long)iVar22;
      lVar10 = (long)(((pFVar6->super_BaseFab<double>).domain.bigend.vect[0] - iVar21) + 1);
      lVar19 = (((pFVar6->super_BaseFab<double>).domain.bigend.vect[1] - iVar40) + 1) * lVar10;
      lVar11 = (((pFVar6->super_BaseFab<double>).domain.bigend.vect[2] - iVar22) + 1) * lVar19;
      pdVar8 = (fab->super_BaseFab<double>).dptr;
      iVar21 = (fab->super_BaseFab<double>).domain.smallend.vect[0];
      lVar37 = (long)iVar21;
      iVar40 = (fab->super_BaseFab<double>).domain.smallend.vect[1];
      lVar28 = (long)iVar40;
      iVar22 = (fab->super_BaseFab<double>).domain.smallend.vect[2];
      lVar31 = (long)iVar22;
      lVar12 = (long)(((fab->super_BaseFab<double>).domain.bigend.vect[0] - iVar21) + 1);
      lVar13 = (long)(((fab->super_BaseFab<double>).domain.bigend.vect[1] - iVar40) + 1);
      lVar24 = (long)(((fab->super_BaseFab<double>).domain.bigend.vect[2] - iVar22) + 1);
      FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                ((Array4<const_double> *)&result,&vol_fine->super_FabArray<amrex::FArrayBox>,&mfi);
      if ((uint)(FVar9 + singlevalued) < 2) {
        if (0 < ncomp) {
          lVar32 = (long)local_484.smallend.vect[1];
          local_4f8 = (long)pdVar8 + lVar12 * lVar24 * lVar1 * lVar13 + lVar37 * -8;
          lVar37 = lVar13 * 8 * lVar12;
          local_4e8 = 0;
          do {
            if (local_484.smallend.vect[2] <= local_484.bigend.vect[2]) {
              local_4d8 = (long)local_484.smallend.vect[2];
              do {
                if (local_484.smallend.vect[1] <= local_484.bigend.vect[1]) {
                  uVar29 = ratio->vect[0];
                  uVar35 = ratio->vect[1];
                  uVar5 = ratio->vect[2];
                  lVar46 = (long)(int)uVar35;
                  lVar48 = (long)local_484.smallend.vect[0] * 8 * (long)(int)uVar29;
                  local_4c8 = (((int)uVar5 * local_4d8 - lVar31) * lVar13 * 8 +
                              lVar32 * 8 * lVar46 + lVar28 * -8) * lVar12 + local_4f8 + lVar48;
                  lVar41 = (long)(int)uVar29 * 8;
                  local_510 = lVar32 * lVar46;
                  local_530 = lVar32;
                  do {
                    if (local_484.smallend.vect[0] <= local_484.bigend.vect[0]) {
                      lVar26 = local_4c8;
                      lVar34 = (long)local_484.smallend.vect[0];
                      lVar43 = lVar48;
                      do {
                        dVar52 = NAN;
                        if (0 < (int)uVar5) {
                          lVar47 = CONCAT44(result.bigend.vect[0],result.smallend.vect[2]) * 8;
                          lVar51 = CONCAT44(result.bigend.vect[2],result.bigend.vect[1]) * 8;
                          lVar49 = ((int)uVar5 * local_4d8 - (long)local_440) * lVar51 +
                                   (local_510 - local_444) * lVar47 + lVar43 + (long)local_448 * -8
                                   + result.smallend.vect._0_8_;
                          dVar53 = 0.0;
                          uVar38 = 0;
                          dVar52 = 0.0;
                          lVar20 = lVar26;
                          do {
                            if (0 < (int)uVar35) {
                              uVar33 = 0;
                              lVar23 = lVar20;
                              lVar42 = lVar49;
                              do {
                                if (0 < (int)uVar29) {
                                  uVar25 = 0;
                                  do {
                                    dVar54 = *(double *)(lVar42 + uVar25 * 8);
                                    dVar53 = dVar53 + dVar54;
                                    dVar52 = dVar52 + dVar54 * *(double *)(lVar23 + uVar25 * 8);
                                    uVar25 = uVar25 + 1;
                                  } while (uVar29 != uVar25);
                                }
                                uVar33 = uVar33 + 1;
                                lVar23 = lVar23 + lVar12 * 8;
                                lVar42 = lVar42 + lVar47;
                              } while (uVar33 != uVar35);
                            }
                            uVar38 = uVar38 + 1;
                            lVar20 = lVar20 + lVar37;
                            lVar49 = lVar49 + lVar51;
                          } while (uVar38 != uVar5);
                          dVar52 = dVar52 / dVar53;
                        }
                        pdVar7[lVar11 * local_4e8 +
                               (local_4d8 - lVar36) * lVar19 +
                               (local_530 - lVar30) * lVar10 + (lVar34 - lVar27)] = dVar52;
                        lVar34 = lVar34 + 1;
                        lVar26 = lVar26 + lVar41;
                        lVar43 = lVar43 + lVar41;
                      } while (local_484.bigend.vect[0] + 1 != (int)lVar34);
                    }
                    local_530 = local_530 + 1;
                    local_4c8 = local_4c8 + lVar12 * 8 * lVar46;
                    local_510 = local_510 + lVar46;
                  } while (local_484.bigend.vect[1] + 1 != (int)local_530);
                }
                local_4d8 = local_4d8 + 1;
              } while (local_484.bigend.vect[2] + 1 != (int)local_4d8);
            }
            local_4e8 = local_4e8 + 1;
            local_4f8 = local_4f8 + lVar24 * lVar37;
          } while (local_4e8 != (uint)ncomp);
        }
      }
      else if (FVar9 == singlevalued) {
        FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                  (&local_258,&vfrac_fine->super_FabArray<amrex::FArrayBox>,&mfi);
        local_4b8 = (long)local_484.smallend.vect[2];
        if (local_484.smallend.vect[2] <= local_484.bigend.vect[2]) {
          lVar32 = lVar13 * lVar12;
          iVar40 = iVar4 * local_484.smallend.vect[2];
          iVar21 = (local_484.smallend.vect[2] + 1) * iVar4;
          do {
            lVar41 = (long)iVar40;
            if (local_484.smallend.vect[1] <= local_484.bigend.vect[1]) {
              lVar46 = local_4b8 * iVar4;
              iVar22 = iVar3 * local_484.smallend.vect[1];
              local_520 = (long)local_484.smallend.vect[1];
              iVar45 = (local_484.smallend.vect[1] + 1) * iVar3;
              do {
                lVar48 = (long)iVar22;
                if (local_484.smallend.vect[0] <= local_484.bigend.vect[0]) {
                  local_518 = (long)local_484.smallend.vect[0];
                  iVar15 = local_484.smallend.vect[0] * iVar2;
                  do {
                    if (0 < ncomp) {
                      local_530 = (long)pdVar8 +
                                  (long)iVar15 * 8 +
                                  ((lVar1 * lVar24 + lVar31 * -8 + lVar41 * 8) * lVar13 +
                                   lVar28 * -8 + lVar48 * 8) * lVar12 + lVar37 * -8;
                      lVar26 = (long)iVar15 * 8;
                      lVar34 = local_518 * iVar2;
                      uVar38 = 0;
                      do {
                        dVar52 = 0.0;
                        dVar53 = 0.0;
                        if (lVar46 < (local_4b8 + 1) * (long)iVar4) {
                          lVar23 = CONCAT44(result.bigend.vect[2],result.bigend.vect[1]) * 8;
                          lVar51 = CONCAT44(result.bigend.vect[0],result.smallend.vect[2]) * 8;
                          lVar47 = (lVar48 - local_444) * lVar51 + (lVar41 - local_440) * lVar23 +
                                   (long)local_448 * -8 + result.smallend.vect._0_8_ + lVar26;
                          lVar49 = (long)local_258.p +
                                   (lVar48 - local_258.begin.y) * local_258.jstride * 8 +
                                   (lVar41 - local_258.begin.z) * local_258.kstride * 8 +
                                   (long)local_258.begin.x * -8 + lVar26;
                          lVar43 = lVar41;
                          lVar20 = local_530;
                          do {
                            lVar42 = lVar49;
                            lVar39 = lVar48;
                            lVar44 = lVar20;
                            lVar50 = lVar47;
                            if (local_520 * lVar16 < (local_520 + 1) * lVar16) {
                              do {
                                if (lVar34 < (local_518 + 1) * (long)iVar2) {
                                  lVar14 = 0;
                                  do {
                                    dVar54 = *(double *)(lVar50 + lVar14 * 8) *
                                             *(double *)(lVar42 + lVar14 * 8);
                                    dVar52 = dVar52 + *(double *)(lVar44 + lVar14 * 8) * dVar54;
                                    dVar53 = dVar53 + dVar54;
                                    lVar14 = lVar14 + 1;
                                  } while (iVar2 != (int)lVar14);
                                }
                                lVar39 = lVar39 + 1;
                                lVar50 = lVar50 + lVar51;
                                lVar42 = lVar42 + local_258.jstride * 8;
                                lVar44 = lVar44 + lVar12 * 8;
                              } while (iVar45 != (int)lVar39);
                            }
                            lVar43 = lVar43 + 1;
                            lVar47 = lVar47 + lVar23;
                            lVar49 = lVar49 + local_258.kstride * 8;
                            lVar20 = lVar20 + lVar32 * 8;
                          } while (iVar21 != (int)lVar43);
                        }
                        if (dVar53 <= 1e-30) {
                          dVar52 = pdVar8[(lVar46 - lVar31) * lVar32 +
                                          (local_520 * lVar16 - lVar28) * lVar12 +
                                          (lVar34 - lVar37) +
                                          ((long)scomp + uVar38) * lVar32 * lVar24];
                          lVar43 = (local_4b8 - lVar36) * lVar19 +
                                   (local_520 - lVar30) * lVar10 + (local_518 - lVar27);
                        }
                        else {
                          dVar52 = dVar52 / dVar53;
                          lVar43 = (local_4b8 - lVar36) * lVar19 +
                                   (local_520 - lVar30) * lVar10 + (local_518 - lVar27);
                        }
                        (pdVar7 + lVar43)[lVar11 * uVar38] = dVar52;
                        uVar38 = uVar38 + 1;
                        local_530 = local_530 + lVar24 * lVar32 * 8;
                      } while (uVar38 != (uint)ncomp);
                    }
                    local_518 = local_518 + 1;
                    iVar15 = iVar15 + iVar2;
                  } while (local_484.bigend.vect[0] + 1 != (int)local_518);
                }
                local_520 = local_520 + 1;
                iVar22 = iVar22 + iVar3;
                iVar45 = iVar45 + iVar3;
              } while (local_484.bigend.vect[1] + 1 != (int)local_520);
            }
            local_4b8 = local_4b8 + 1;
            iVar40 = iVar40 + iVar4;
            iVar21 = iVar21 + iVar4;
          } while (local_484.bigend.vect[2] + 1 != (int)local_4b8);
        }
      }
      else {
        Abort_host("multi-valued avgdown to be implemented");
      }
      MFIter::operator++(&mfi);
    } while (mfi.currentIndex < mfi.endIndex);
  }
  MFIter::~MFIter(&mfi);
  period = Periodicity::NonPeriodic();
  mfi.m_fa._M_t.
  super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>._M_t.
  super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>.
  super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl =
       (__uniq_ptr_data<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>,_true,_true>)
       (__uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>)0x0;
  mfi.fabArray = (FabArrayBase *)((ulong)mfi.fabArray & 0xffffffff00000000);
  result.smallend.vect[0] = 0;
  result.smallend.vect[1] = 0;
  result.smallend.vect[2] = 0;
  FabArray<amrex::FArrayBox>::ParallelCopy_nowait
            (&S_crse->super_FabArray<amrex::FArrayBox>,&crse_S_fine.super_FabArray<amrex::FArrayBox>
             ,0,scomp,ncomp,(IntVect *)&mfi,&result.smallend,period,COPY,(CPC *)0x0,false);
  MultiFab::~MultiFab(&crse_S_fine);
  BoxArray::~BoxArray(&crse_S_fine_BA);
  return;
}

Assistant:

void
EB_average_down (const MultiFab& S_fine, MultiFab& S_crse, const MultiFab& vol_fine,
                 const MultiFab& vfrac_fine, int scomp, int ncomp, const IntVect& ratio)
{
    BL_PROFILE("EB_average_down");

    AMREX_ASSERT(S_fine.ixType().cellCentered());
    AMREX_ASSERT(S_crse.ixType().cellCentered());

    const DistributionMapping& fine_dm = S_fine.DistributionMap();
    BoxArray crse_S_fine_BA = S_fine.boxArray();
    crse_S_fine_BA.coarsen(ratio);

    MultiFab crse_S_fine(crse_S_fine_BA,fine_dm,ncomp,0,MFInfo(),FArrayBoxFactory());

    Dim3 dratio = ratio.dim3();

#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
    for (MFIter mfi(crse_S_fine,TilingIfNotGPU()); mfi.isValid(); ++mfi)
    {
        const Box& tbx = mfi.tilebox();
        auto& crse_fab = crse_S_fine[mfi];
        const auto& fine_fab = S_fine[mfi];

        const auto& flag_fab = amrex::getEBCellFlagFab(fine_fab);
        FabType typ = flag_fab.getType(amrex::refine(tbx,ratio));

        Array4<Real> const& crse_arr = crse_fab.array();
        Array4<Real const> const& fine_arr = fine_fab.const_array();
        Array4<Real const> const& vol = vol_fine.const_array(mfi);

        if (typ == FabType::regular || typ == FabType::covered)
        {
            AMREX_HOST_DEVICE_PARALLEL_FOR_4D(tbx, ncomp, i, j, k, n,
            {
                amrex_avgdown_with_vol(i,j,k,n, crse_arr, fine_arr, vol, 0, scomp, ratio);
            });
        }
        else if (typ == FabType::singlevalued)
        {
            Array4<Real const> const& vfrac = vfrac_fine.const_array(mfi);
            AMREX_HOST_DEVICE_FOR_3D(tbx, i, j, k,
            {
                eb_avgdown_with_vol(i,j,k,fine_arr,scomp,crse_arr,0,vol,vfrac,dratio,ncomp);
            });
        }
        else
        {
            amrex::Abort("multi-valued avgdown to be implemented");
        }
    }

    S_crse.ParallelCopy(crse_S_fine,0,scomp,ncomp);
}